

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall
CRegexParser::build_assert
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int is_negative,
          int is_lookback)

{
  int id;
  re_state_id final;
  re_tuple_conflict *prVar1;
  re_recog_type typ;
  
  init_machine(this,new_machine);
  prVar1 = this->tuple_arr_;
  id = new_machine->init;
  typ = RE_ASSERT_NEG - (is_negative == 0);
  if (is_lookback != 0) {
    typ = RE_ASSERT_BACKNEG - (is_negative == 0);
  }
  set_trans(this,id,new_machine->final,typ,L'\0');
  prVar1[id].info.ch = sub_machine->init;
  final = sub_machine->final;
  prVar1[id].info.sub.final = final;
  if (is_lookback != 0) {
    get_match_length(this,sub_machine->init,final,&prVar1[id].info.sub.minlen,
                     &prVar1[id].info.sub.maxlen,(regex_scan_frame *)0x0);
    return;
  }
  return;
}

Assistant:

void CRegexParser::build_assert(re_machine *new_machine,
                                re_machine *sub_machine,
                                int is_negative, int is_lookback)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* get a pointer to its initial state */
    re_tuple *t = &tuple_arr_[new_machine->init];

    /* allocate a transition tuple for the new state */
    set_trans(new_machine->init, new_machine->final,
              (is_lookback
               ? (is_negative ? RE_ASSERT_BACKNEG : RE_ASSERT_BACKPOS)
               : (is_negative ? RE_ASSERT_NEG : RE_ASSERT_POS)),
              0);

    /* set the sub-state */
    t->info.sub.init = sub_machine->init;
    t->info.sub.final = sub_machine->final;

    /* 
     *   For lookback assertions, we need to know the range of possible match
     *   lengths, to optimize the reverse search for a match.  The
     *   sub-machine for the assertion is fully built now and is by nature
     *   self-contained, so we can calculate its length range now.  
     */
    if (is_lookback)
        get_match_length(sub_machine->init, sub_machine->final,
                         &t->info.sub.minlen, &t->info.sub.maxlen, 0);
}